

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggressive_dead_code_elim_pass.cpp
# Opt level: O2

Instruction * __thiscall
spvtools::opt::AggressiveDCEPass::GetHeaderBranch(AggressiveDCEPass *this,BasicBlock *blk)

{
  BasicBlock *this_00;
  Instruction *pIVar1;
  
  if (blk != (BasicBlock *)0x0) {
    this_00 = GetHeaderBlock(this,blk);
    if (this_00 != (BasicBlock *)0x0) {
      pIVar1 = BasicBlock::terminator(this_00);
      return pIVar1;
    }
  }
  return (Instruction *)0x0;
}

Assistant:

Instruction* AggressiveDCEPass::GetHeaderBranch(BasicBlock* blk) {
  if (blk == nullptr) {
    return nullptr;
  }
  BasicBlock* header_block = GetHeaderBlock(blk);
  if (header_block == nullptr) {
    return nullptr;
  }
  return header_block->terminator();
}